

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O2

void __thiscall
sqlcheck::TestSuite_PhysicalDesignTests_Test::~TestSuite_PhysicalDesignTests_Test
          (TestSuite_PhysicalDesignTests_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(TestSuite, PhysicalDesignTests) {

  Configuration default_conf;
  default_conf.testing_mode = true;
  default_conf.verbose = false;

  std::unique_ptr<std::istringstream> stream(new std::istringstream());
  stream->str(

      "CREATE TABLE Bugs ("
      "-- other columns"
      "status ENUM('NEW', 'IN PROGRESS', 'FIXED'), );\n"

      "CREATE TABLE Bugs ("
      "-- other columns"
      "status VARCHAR(20) CHECK (status IN ('NEW', 'IN PROGRESS', 'FIXED')) );\n"

      "ALTER TABLE Bugs MODIFY COLUMN status ENUM('NEW', 'IN PROGRESS', 'CODE COMPLETE', 'VERIFIED');\n"

      "CREATE TABLE Screenshots ("
      "bug_id            BIGINT UNSIGNED NOT NULL,"
      "image_id          BIGINT UNSIGNED NOT NULL,"
      "screenshot_path   VARCHAR(100),"
      "caption           VARCHAR(100),"
      "PRIMARY KEY       (bug_id, image_id),"
      "FOREIGN KEY (bug_id) REFERENCES Bugs(bug_id)"
      ");\n"

      "unlink('images/screenshot1234-1.jpg' );\n"

      "CREATE TABLE Bugs ("
      "bug_id SERIAL PRIMARY KEY,"
      "date_reported DATE NOT NULL,"
      "INDEX (bug_id),"
      "INDEX (summary),"
      "INDEX (hours),"
      "INDEX (bug_id, date_reported, status)"
      ");\n"

      "CREATE INDEX TelephoneBook ON Accounts(last_name, first_name);\n"

  );

  default_conf.test_stream.reset(stream.release());

  Check(default_conf);

}